

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckOperator.cxx
# Opt level: O3

bool __thiscall
kws::Parser::FindOperator
          (Parser *this,char *op,uint before,uint after,unsigned_long maxSize,
          bool doNotCheckInsideParenthesis)

{
  string *psVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  size_t pos;
  size_t sVar6;
  long lVar7;
  unsigned_long uVar8;
  size_type sVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pcVar12;
  size_t sVar13;
  ulong uVar14;
  string currentLine;
  string previousLine;
  uint local_f4;
  undefined1 local_e0 [24];
  char local_c8 [8];
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  char *local_a0;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  psVar1 = &this->m_BufferNoComment;
  local_98 = (pointer)maxSize;
  strlen(op);
  local_a0 = op;
  pos = std::__cxx11::string::find((char *)psVar1,(ulong)op,0);
  if (pos == 0xffffffffffffffff) {
    bVar5 = 1;
  }
  else {
    local_a8 = 0;
    do {
      bVar4 = true;
      if ((long)pos < 2) {
        local_f4 = 0;
      }
      else {
        local_f4 = 0;
        uVar14 = pos;
        do {
          sVar13 = uVar14 - 1;
          cVar2 = (psVar1->_M_dataplus)._M_p[sVar13];
          if ((cVar2 == '\n') || (cVar2 == '\r')) {
            lVar7 = GetLineNumber(this,sVar13,true);
            GetLine_abi_cxx11_((string *)local_e0,this,lVar7 - 1);
            uVar8 = GetLineNumber(this,sVar13,true);
            GetLine_abi_cxx11_(&local_70,this,uVar8);
            pcVar12 = (pointer)(local_e0._8_8_ + local_70._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_);
            }
            if (local_98 < pcVar12) {
              bVar4 = false;
              break;
            }
          }
          else {
            if (cVar2 != ' ') break;
            local_f4 = local_f4 + 1;
          }
          bVar3 = 2 < uVar14;
          uVar14 = sVar13;
        } while (bVar3);
      }
      sVar6 = strlen(local_a0);
      sVar13 = sVar6 + pos;
      sVar9 = (this->m_BufferNoComment)._M_string_length;
      uVar14 = 0;
      if ((long)sVar13 < (long)sVar9) {
        uVar14 = 0;
        do {
          cVar2 = (psVar1->_M_dataplus)._M_p[sVar13];
          if (cVar2 == '\n') {
LAB_00154ee9:
            lVar7 = GetLineNumber(this,sVar13,true);
            GetLine_abi_cxx11_((string *)local_e0,this,lVar7 - 1);
            uVar8 = GetLineNumber(this,sVar13,true);
            GetLine_abi_cxx11_(&local_70,this,uVar8);
            pcVar12 = (pointer)(local_e0._8_8_ + local_70._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_);
            }
            if (local_98 < pcVar12) goto LAB_00155212;
            sVar9 = (this->m_BufferNoComment)._M_string_length;
          }
          else {
            if (cVar2 != ' ') {
              if (cVar2 == '\r') goto LAB_00154ee9;
              break;
            }
            uVar14 = (ulong)((int)uVar14 + 1);
          }
          sVar13 = sVar13 + 1;
        } while ((long)sVar13 < (long)sVar9);
      }
      if (((bVar4) && ((uint)uVar14 != after || local_f4 != before)) &&
         (lVar7 = std::__cxx11::string::find((char *)psVar1,0x176e5b,pos - 0xb),
         pos != lVar7 + 8U && doNotCheckInsideParenthesis)) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
        bVar4 = IsBetweenCharsFast(this,'(',')',pos,false,&local_90);
        if (bVar4) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        else {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
          bVar4 = IsBetweenQuote(this,pos,false,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if (!bVar4) {
            local_c8 = (char  [8])&local_b8;
            local_c0 = (char *)0x0;
            local_b8._M_local_buf[0] = '\0';
            local_e0._0_8_ = GetLineNumber(this,pos,true);
            local_e0._16_8_ = 0x17;
            local_e0._8_8_ = local_e0._0_8_;
            std::__cxx11::string::_M_replace((ulong)local_c8,0,local_c0,0x176ad8);
            std::__cxx11::string::append(local_c8);
            pcVar10 = (char *)operator_new__(10);
            snprintf(pcVar10,10,"%d",(ulong)local_f4);
            std::__cxx11::string::append(local_c8);
            std::__cxx11::string::append(local_c8);
            snprintf(pcVar10,10,"%d",(ulong)before);
            std::__cxx11::string::append(local_c8);
            std::__cxx11::string::append(local_c8);
            snprintf(pcVar10,10,"%d",uVar14);
            std::__cxx11::string::append(local_c8);
            std::__cxx11::string::append(local_c8);
            snprintf(pcVar10,10,"%d",(ulong)after);
            std::__cxx11::string::append(local_c8);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,(value_type *)local_e0);
            operator_delete__(pcVar10);
            paVar11 = &local_b8;
            if (local_c8 != (char  [8])paVar11) {
              operator_delete((void *)local_c8);
              paVar11 = extraout_RAX;
            }
            local_a8 = CONCAT71((int7)((ulong)paVar11 >> 8),1);
          }
        }
      }
LAB_00155212:
      pcVar10 = local_a0;
      strlen(local_a0);
      pos = std::__cxx11::string::find((char *)psVar1,(ulong)pcVar10,pos + 1);
    } while (pos != 0xffffffffffffffff);
    bVar5 = (byte)local_a8 ^ 1;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool Parser::FindOperator(const char* op,unsigned int before, 
                          unsigned int after,
                          unsigned long maxSize,
                          bool doNotCheckInsideParenthesis
                          )
{
  bool hasErrors = false;
  long int pos = 0;
  size_t operatorPos = m_BufferNoComment.find(op,pos);
  while(operatorPos != std::string::npos) 
    {
    bool showError=true;
    // Check number of space before
    unsigned int bef = 0;
    long int i = static_cast<long int>(operatorPos)-1;
    while((i>0) && ((m_BufferNoComment[i] == ' ')
       || (m_BufferNoComment[i] == '\r')
       || (m_BufferNoComment[i] == '\n'))
       )
      {
      if((m_BufferNoComment[i] != '\r')
       && (m_BufferNoComment[i] != '\n'))
        {
        bef++;
        }
      else
        {
        // check if the sum of the two lines is higher than the maximum length
        std::string currentLine = this->GetLine(this->GetLineNumber(i,true)-1);
        std::string previousLine = this->GetLine(this->GetLineNumber(i,true));
        auto sum = static_cast<unsigned long>(currentLine.size() +
                                              previousLine.size());
        if(sum>maxSize)
          {
          showError = false;
          break;
          }
        }
      i--;
      }

    // Check number of space after
    unsigned int aft = 0;
    i = static_cast<long int>(operatorPos+strlen(op));
    while((i<(long int)m_BufferNoComment.size())
           && ((m_BufferNoComment[i] == ' ')
           || (m_BufferNoComment[i] == '\r')
           || (m_BufferNoComment[i] == '\n')
           )
           )
      {
      if((m_BufferNoComment[i] == '\r')
        || (m_BufferNoComment[i] == '\n'))
        {
        // check if the sum of the two lines is higher than the maximum length
        std::string currentLine = this->GetLine(this->GetLineNumber(i,true)-1);
        std::string nextLine = this->GetLine(this->GetLineNumber(i,true));
        auto sum =
            static_cast<unsigned long>(currentLine.size() + nextLine.size());
        if(sum>maxSize)
          {
          showError = false;
          break;
          }
        }
      else
        {
        aft++;
        }
      i++;
      }
   
    if(showError  && (bef != before || aft != after))
      {
      // we make sure that the keyword operator is not defined right before
      if(operatorPos != m_BufferNoComment.find("operator",operatorPos-11)+8
        && (doNotCheckInsideParenthesis && !this->IsBetweenCharsFast('(',')',operatorPos,false)
        && !this->IsBetweenQuote(operatorPos,false)
        ) 
        )
        {
        Error error;
        error.line = this->GetLineNumber(operatorPos,true);
        error.line2 = error.line;
        error.number = OPERATOR;
        error.description = "Spaces around operator are wrong: ";
        error.description += "before = ";
        constexpr size_t length = 10;
        char* val = new char[length];
        snprintf(val,length,"%d",bef);
        error.description += val;
        error.description += " v.s ";
        snprintf(val,length,"%d",before);
        error.description += val;
        error.description += " ,after = ";
        snprintf(val,length,"%d",aft);
        error.description += val;
        error.description += " v.s ";
        snprintf(val,length,"%d",after);
        error.description += val;
        m_ErrorList.push_back(error);
        delete [] val;
        hasErrors = true;
        }
      }
    pos = static_cast<long int>(operatorPos)+1;
    operatorPos = m_BufferNoComment.find(op,operatorPos+1);  
    }
  return !hasErrors;
}